

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_28;
  
  pbVar1 = (tokens->it)._M_current;
  pbVar2 = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (&local_28,&tokens->m_tokenBuffer);
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  .m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b6280;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_type = NoMatch;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = pbVar1;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pbVar2;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
              field_0.m_value.m_remainingTokens.m_tokenBuffer,&local_28);
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b6228;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
        }